

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::UpdateProgress(cmCursesMainForm *this,string *msg,float prog)

{
  char *pcVar1;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  int percentCompleted;
  int progressBarCompleted;
  int progressBarWidth;
  float prog_local;
  string *msg_local;
  cmCursesMainForm *this_local;
  
  progressBarCompleted = (int)prog;
  _progressBarWidth = msg;
  msg_local = (string *)this;
  if (prog < 0.0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Outputs,
               msg);
    DisplayOutputs(this,_progressBarWidth);
  }
  else {
    percentCompleted = 0x28;
    local_24 = (int)(prog * 40.0);
    local_28 = (int)(prog * 100.0);
    pcVar1 = "";
    if (local_28 < 100) {
      pcVar1 = " ";
    }
    std::__cxx11::string::operator=((string *)&this->LastProgress,pcVar1);
    pcVar1 = "";
    if (local_28 < 10) {
      pcVar1 = " ";
    }
    std::__cxx11::string::operator+=((string *)&this->LastProgress,pcVar1);
    std::__cxx11::to_string(&local_68,local_28);
    std::operator+(&local_48,&local_68,"% [");
    std::__cxx11::string::operator+=((string *)&this->LastProgress,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::append((ulong)&this->LastProgress,(char)local_24);
    std::__cxx11::string::append((ulong)&this->LastProgress,'(' - (char)local_24);
    std::operator+(&local_b8,"] ",_progressBarWidth);
    std::operator+(&local_98,&local_b8,"...");
    std::__cxx11::string::operator+=((string *)&this->LastProgress,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)&local_d8);
    DisplayOutputs(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateProgress(const std::string& msg, float prog)
{
  if (prog >= 0) {
    constexpr int progressBarWidth = 40;
    int progressBarCompleted = static_cast<int>(progressBarWidth * prog);
    int percentCompleted = static_cast<int>(100 * prog);
    this->LastProgress = (percentCompleted < 100 ? " " : "");
    this->LastProgress += (percentCompleted < 10 ? " " : "");
    this->LastProgress += std::to_string(percentCompleted) + "% [";
    this->LastProgress.append(progressBarCompleted, '#');
    this->LastProgress.append(progressBarWidth - progressBarCompleted, ' ');
    this->LastProgress += "] " + msg + "...";
    this->DisplayOutputs(std::string());
  } else {
    this->Outputs.emplace_back(msg);
    this->DisplayOutputs(msg);
  }
}